

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

void recall_tree_ns::finish(recall_tree *b)

{
  void *__ptr;
  ulong uVar1;
  undefined8 *puVar2;
  node *__ptr_00;
  long lVar3;
  
  __ptr_00 = (b->nodes)._begin;
  if ((b->nodes)._end != __ptr_00) {
    lVar3 = 0x38;
    uVar1 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_00->parent + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      puVar2 = (undefined8 *)((long)&__ptr_00->parent + lVar3);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2[2] = 0;
      uVar1 = uVar1 + 1;
      __ptr_00 = (b->nodes)._begin;
      lVar3 = lVar3 + 0x58;
    } while (uVar1 < (ulong)(((long)(b->nodes)._end - (long)__ptr_00 >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  if (__ptr_00 != (node *)0x0) {
    free(__ptr_00);
  }
  (b->nodes)._begin = (node *)0x0;
  (b->nodes)._end = (node *)0x0;
  (b->nodes).end_array = (node *)0x0;
  return;
}

Assistant:

void finish(recall_tree& b)
{
  for (size_t i = 0; i < b.nodes.size(); ++i) b.nodes[i].preds.delete_v();
  b.nodes.delete_v();
}